

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

bool __thiscall
slang::IntervalMap<int,_int,_0U>::iterator::insertNode
          (iterator *this,uint32_t level,NodeRef node,interval<int> *key,allocator_type *alloc)

{
  Path *this_00;
  uint uVar1;
  IntervalMap<int,_int,_0U> *this_01;
  pointer pEVar2;
  void *pvVar3;
  uint32_t uVar4;
  uintptr_t intWord;
  IndexPair offset;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  this_00 = &(this->super_const_iterator).path;
  bVar8 = level == 1;
  if (bVar8) {
    this_01 = (this->super_const_iterator).map;
    uVar7 = this_01->rootSize;
    uVar1 = ((this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->
            offset;
    if (uVar7 < 0xc) {
      while (uVar7 != uVar1) {
        uVar5 = (ulong)uVar7;
        uVar7 = uVar7 - 1;
        *(undefined8 *)((long)&this_01->field_0 + uVar5 * 8) =
             *(undefined8 *)((long)&this_01->field_0 + (ulong)uVar7 * 8);
        *(undefined8 *)((long)&this_01->field_0 + uVar5 * 8 + 0x60) =
             *(undefined8 *)((long)&this_01->field_0 + (ulong)uVar7 * 8 + 0x60);
      }
      *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)((long)&this_01->field_0 + (ulong)uVar1 * 8)
           = node.pip.value;
      *(interval<int> *)((long)&this_01->field_0 + (ulong)uVar1 * 8 + 0x60) = *key;
      uVar4 = this_01->rootSize + 1;
      this_01->rootSize = uVar4;
      pEVar2 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
      pEVar2->size = uVar4;
      uVar5 = *(ulong *)((long)pEVar2->node + (ulong)pEVar2->offset * 8);
      pEVar2[1].node = (void *)(uVar5 & 0xffffffffffffffc0);
      pEVar2[1].size = ((uint)uVar5 & 0x3f) + 1;
      return false;
    }
    offset = IntervalMap<int,int,0u>::
             modifyRoot<slang::IntervalMapDetails::BranchNode<int,12u,true>,slang::IntervalMapDetails::BranchNode<int,12u,false>,false>
                       ((IntervalMap<int,int,0u> *)this_01,(BranchNode<int,_12U,_true> *)this_01,
                        uVar1,alloc);
    IntervalMapDetails::Path::replaceRoot<slang::IntervalMapDetails::BranchNode<int,12u,true>>
              (this_00,(BranchNode<int,_12U,_true> *)this_01,this_01->rootSize,offset);
    level = 2;
  }
  uVar7 = level - 1;
  uVar5 = (ulong)uVar7;
  IntervalMapDetails::Path::legalizeForInsert(this_00,uVar7);
  if ((this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_[uVar5].
      size == 0xc) {
    bVar8 = IntervalMap<int,int,0u>::iterator::
            overflow<slang::IntervalMapDetails::BranchNode<int,12u,false>>
                      ((iterator *)this,uVar7,alloc);
    if (!bVar8) {
      level = uVar7;
    }
    uVar5 = (ulong)level;
  }
  pEVar2 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  pvVar3 = pEVar2[uVar5].node;
  uVar1 = pEVar2[uVar5].offset;
  uVar7 = pEVar2[uVar5].size;
  while (uVar7 != uVar1) {
    uVar6 = (ulong)uVar7;
    uVar7 = uVar7 - 1;
    *(undefined8 *)((long)pvVar3 + uVar6 * 8) = *(undefined8 *)((long)pvVar3 + (ulong)uVar7 * 8);
    *(undefined8 *)((long)pvVar3 + uVar6 * 8 + 0x60) =
         *(undefined8 *)((long)pvVar3 + (ulong)uVar7 * 8 + 0x60);
  }
  ((PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)((long)pvVar3 + (ulong)uVar1 * 8))->value =
       (uintptr_t)node.pip.value;
  *(interval<int> *)((long)pvVar3 + (ulong)uVar1 * 8 + 0x60) = *key;
  pEVar2 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  uVar7 = pEVar2[uVar5].size;
  pEVar2[uVar5].size = uVar7 + 1;
  uVar4 = (uint32_t)uVar5;
  if (uVar5 != 0) {
    *(ulong *)((long)pEVar2[uVar4 - 1].node + (ulong)pEVar2[uVar4 - 1].offset * 8) =
         *(ulong *)((long)pEVar2[uVar4 - 1].node + (ulong)pEVar2[uVar4 - 1].offset * 8) &
         0xffffffffffffffc0 | (ulong)uVar7;
  }
  updateParentBounds(this,uVar4,key);
  pEVar2 = (this->super_const_iterator).path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  uVar5 = *(ulong *)((long)pEVar2[uVar5].node + (ulong)pEVar2[uVar5].offset * 8);
  pEVar2[uVar4 + 1].node = (void *)(uVar5 & 0xffffffffffffffc0);
  pEVar2[uVar4 + 1].size = ((uint)uVar5 & 0x3f) + 1;
  return bVar8;
}

Assistant:

bool IntervalMap<TKey, TValue, N>::iterator::insertNode(
    uint32_t level, IntervalMapDetails::NodeRef node, const IntervalMapDetails::interval<TKey>& key,
    allocator_type& alloc) {
    SLANG_ASSERT(level > 0);

    bool split = false;
    auto& map = *this->map;
    auto& path = this->path;

    if (level == 1) {
        // Insert into the root branch node.
        if (map.rootSize < RootBranch::Capacity) {
            map.rootBranch.insert(path.offset(0), map.rootSize, node, key);
            path.setSize(0, ++map.rootSize);
            path.reset(level);
            return false;
        }

        // We need to split the root while keeping our position.
        split = true;
        auto newOffset = map.splitRoot(path.offset(0), alloc);
        path.replaceRoot(&map.rootBranch, map.rootSize, newOffset);

        // Fall through to insert at the new higher level.
        level++;
    }

    // When inserting before end, make sure we have a valid path.
    path.legalizeForInsert(--level);

    if (path.size(level) == Branch::Capacity) {
        // Branch node is full, we need to split it.
        SLANG_ASSERT(!split);
        split = overflow<Branch>(level, alloc);
        if (split)
            level++;
    }

    // Actually insert into the branch node.
    path.template node<Branch>(level).insert(path.offset(level), path.size(level), node, key);
    path.setSize(level, path.size(level) + 1);
    updateParentBounds(level, key);

    path.reset(level + 1);
    return split;
}